

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O0

DisasJumpType op_vfsq(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t aofs;
  code *local_38;
  undefined1 *fn;
  uint8_t m4;
  uint8_t fpf;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = get_field1(s,FLD_O_m3,FLD_C_i3);
  uVar2 = get_field1(s,FLD_O_m4,FLD_C_b4);
  local_38 = gen_helper_gvec_vfsq64;
  if (((char)iVar1 == '\x03') && (uVar3 = extract32(uVar2 & 0xff,0,3), uVar3 == 0)) {
    uVar3 = extract32(uVar2 & 0xff,3,1);
    if (uVar3 != 0) {
      local_38 = gen_helper_gvec_vfsq64s;
    }
    iVar1 = get_field1(s,FLD_O_v1,FLD_C_b1);
    uVar3 = vec_full_reg_offset((uint8_t)iVar1);
    iVar1 = get_field1(s,FLD_O_v2,FLD_C_d4);
    aofs = vec_full_reg_offset((uint8_t)iVar1);
    tcg_gen_gvec_2_ptr_s390x(tcg_ctx_00,uVar3,aofs,tcg_ctx_00->cpu_env,0x10,0x10,0,local_38);
    return DISAS_NEXT;
  }
  gen_program_exception(s,6);
  return DISAS_NORETURN;
}

Assistant:

static DisasJumpType op_vfsq(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t fpf = get_field(s, m3);
    const uint8_t m4 = get_field(s, m4);
    gen_helper_gvec_2_ptr *fn = gen_helper_gvec_vfsq64;

    if (fpf != FPF_LONG || extract32(m4, 0, 3)) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    if (extract32(m4, 3, 1)) {
        fn = gen_helper_gvec_vfsq64s;
    }
    gen_gvec_2_ptr(tcg_ctx, get_field(s, v1), get_field(s, v2), tcg_ctx->cpu_env,
                   0, fn);
    return DISAS_NEXT;
}